

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_stats.cpp
# Opt level: O3

BaseStatistics * duckdb::ListStats::GetChildStats(BaseStatistics *stats)

{
  StatisticsType SVar1;
  InternalException *this;
  string local_40;
  
  SVar1 = BaseStatistics::GetStatsType(&stats->type);
  if (SVar1 == LIST_STATS) {
    return (stats->child_stats).
           super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
           .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"ListStats::GetChildStats called on stats that is not a list","");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const BaseStatistics &ListStats::GetChildStats(const BaseStatistics &stats) {
	if (stats.GetStatsType() != StatisticsType::LIST_STATS) {
		throw InternalException("ListStats::GetChildStats called on stats that is not a list");
	}
	D_ASSERT(stats.child_stats);
	return stats.child_stats[0];
}